

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

void __thiscall
t_netstd_generator::generate_netstd_union_definition
          (t_netstd_generator *this,ostream *out,t_struct *tunion)

{
  int *piVar1;
  t_program *program;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer pptVar4;
  _Alloc_hider _Var5;
  t_struct *ptVar6;
  t_struct undefined_struct;
  bool needs_typecast;
  string local_180;
  t_struct local_160;
  t_struct *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  start_netstd_namespace(this,out);
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"public abstract partial class ",0x1e);
  iVar2 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])(tunion);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)CONCAT44(extraout_var,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," : TUnionBase",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "public abstract global::System.Threading.Tasks.Task WriteAsync(TProtocol tProtocol, CancellationToken "
             ,0x66);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                      CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,");",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_180._M_dataplus._M_p,local_180._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"public readonly int Isset;",0x1a);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,
                                              local_90._M_dataplus._M_p._0_1_),
                      local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"public abstract object Data { get; }",0x24);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"protected ",10);
  iVar2 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])(tunion);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)CONCAT44(extraout_var_00,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var_00,iVar2))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(int isset)",0xb);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
      &local_90.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Isset = isset;",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"public override bool Equals(object that)",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"if (!(that is ",0xe);
  iVar2 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])(tunion);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)CONCAT44(extraout_var_01,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var_01,iVar2))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," other)) return false;",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"if (ReferenceEquals(this, other)) return true;",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"if(this.Isset != other.Isset) return false;",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"switch (Isset)",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  _Var5._M_p = (pointer)out;
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  pptVar4 = (tunion->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_98 = tunion;
  if (pptVar4 !=
      (tunion->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_90._M_dataplus._M_p._0_1_ = 0;
      get_deep_copy_method_call_abi_cxx11_
                ((string *)&local_160,(t_netstd_generator *)_Var5._M_p,(*pptVar4)->type_,
                 (bool *)&local_90);
      t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_180._M_dataplus._M_p,local_180._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"case ",5);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar4)->key_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_180._M_dataplus._M_p,local_180._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"return Equals(As_",0x11);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,((*pptVar4)->name_)._M_dataplus._M_p,
                          ((*pptVar4)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", other.As_",0xb);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,((*pptVar4)->name_)._M_dataplus._M_p,
                          ((*pptVar4)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,");",2);
      _Var5 = ::endl_abi_cxx11_._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
          (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
        operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
      }
      pptVar4 = pptVar4 + 1;
    } while (pptVar4 !=
             (local_98->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"default:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar6 = local_98;
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"return true;",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -2;
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"public override int GetHashCode()",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"switch (Isset)",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
  _Var5 = ::endl_abi_cxx11_._M_dataplus;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar4 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar4 !=
      (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_90._M_dataplus._M_p._0_1_ = 0;
      get_deep_copy_method_call_abi_cxx11_
                ((string *)&local_160,(t_netstd_generator *)_Var5._M_p,(*pptVar4)->type_,
                 (bool *)&local_90);
      t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_180._M_dataplus._M_p,local_180._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"case ",5);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar4)->key_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_180._M_dataplus._M_p,local_180._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"return As_",10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,((*pptVar4)->name_)._M_dataplus._M_p,
                          ((*pptVar4)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".GetHashCode();",0xf);
      _Var5 = ::endl_abi_cxx11_._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
          (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
        operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
      }
      pptVar4 = pptVar4 + 1;
    } while (pptVar4 !=
             (local_98->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"default:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar6 = local_98;
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"return (new ___undefined()).GetHashCode();",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -2;
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  if (this->suppress_deepcopy == false) {
    t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                        (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"public ",7);
    iVar2 = (*(ptVar6->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,*(char **)CONCAT44(extraout_var_02,iVar2),
                        ((undefined8 *)CONCAT44(extraout_var_02,iVar2))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," DeepCopy()",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
      operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
    }
    t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                        (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
      operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                        (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"switch (Isset)",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
      operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
    }
    t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                        (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
    _Var5 = ::endl_abi_cxx11_._M_dataplus;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
      operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    pptVar4 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar4 !=
        (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        local_90._M_dataplus._M_p._0_1_ = 0;
        get_deep_copy_method_call_abi_cxx11_
                  ((string *)&local_160,(t_netstd_generator *)_Var5._M_p,(*pptVar4)->type_,
                   (bool *)&local_90);
        t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_180._M_dataplus._M_p,local_180._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"case ",5);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar4)->key_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_180._M_dataplus._M_p,local_180._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"return new ",0xb);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,((*pptVar4)->name_)._M_dataplus._M_p,
                            ((*pptVar4)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(As_",4);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,((*pptVar4)->name_)._M_dataplus._M_p,
                            ((*pptVar4)->name_)._M_string_length);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                            (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,");",2);
        _Var5 = ::endl_abi_cxx11_._M_dataplus;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
            (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
          operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
        }
        pptVar4 = pptVar4 + 1;
      } while (pptVar4 !=
               (local_98->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                        (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"default:",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    ptVar6 = local_98;
    if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
      operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                        (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"return new ___undefined();",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
      operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -2;
    t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                        (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
      operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                        (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
      operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
    }
  }
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"public class ___undefined : ",0x1c);
  iVar2 = (*(ptVar6->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)CONCAT44(extraout_var_03,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var_03,iVar2))[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                      (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"public override object Data { get { return null; } }",0x34);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_180._M_dataplus._M_p,local_180._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"public ___undefined() : base(0) {}",0x22);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
    operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
  }
  if (this->suppress_deepcopy == false) {
    t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                        (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"public new ___undefined DeepCopy()",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
      operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
    }
    t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                        (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
      operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                        (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"return new ___undefined();",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
      operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_((string *)&local_160,(t_generator *)this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)local_160.super_t_type.super_t_doc._vptr_t_doc,
                        (long)local_160.super_t_type.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_160.super_t_type.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_160.super_t_type.super_t_doc.doc_._M_string_length) {
      operator_delete(local_160.super_t_type.super_t_doc._vptr_t_doc);
    }
  }
  program = (this->super_t_oop_generator).super_t_generator.program_;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"___undefined","");
  t_struct::t_struct(&local_160,program,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  generate_netstd_struct_equals(this,out,&local_160);
  generate_netstd_struct_hashcode(this,out,&local_160);
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_180._M_dataplus._M_p,local_180._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "public override global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken "
             ,0x62);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                      CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,
                                              local_90._M_dataplus._M_p._0_1_),
                      local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
      &local_90.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_180._M_dataplus._M_p,local_180._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "throw new TProtocolException( TProtocolException.INVALID_DATA, \"Cannot persist an union type which is not set.\");"
             ,0x71);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_180._M_dataplus._M_p,local_180._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_180._M_dataplus._M_p,local_180._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  for (pptVar4 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    generate_netstd_union_class(this,out,ptVar6,*pptVar4);
  }
  generate_netstd_union_reader(this,out,ptVar6);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_180._M_dataplus._M_p,local_180._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((this->namespace_name_)._M_string_length != 0) {
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  }
  local_160.super_t_type.super_t_doc._vptr_t_doc = (_func_int **)&PTR__t_struct_0040eeb8;
  if (local_160.members_in_id_order_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.members_in_id_order_.
                    super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_160.members_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.members_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  t_type::~t_type(&local_160.super_t_type);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_union_definition(ostream& out, t_struct* tunion)
{
    // Let's define the class first
    start_netstd_namespace(out);

    out << indent() << "public abstract partial class " << tunion->get_name() << " : TUnionBase" << endl;
    out << indent() << "{" << endl;
    indent_up();

    out << indent() << "public abstract global::System.Threading.Tasks.Task WriteAsync(TProtocol tProtocol, CancellationToken " << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "public readonly int Isset;" << endl
        << indent() << "public abstract object Data { get; }" << endl
        << indent() << "protected " << tunion->get_name() << "(int isset)" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "Isset = isset;" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    const vector<t_field*>& fields = tunion->get_members();
    vector<t_field*>::const_iterator f_iter;

    out << indent() << "public override bool Equals(object that)" << endl;
    scope_up(out);
    out << indent() << "if (!(that is " << tunion->get_name() << " other)) return false;" << endl;
    out << indent() << "if (ReferenceEquals(this, other)) return true;" << endl;
    out << endl;
    out << indent() << "if(this.Isset != other.Isset) return false;" << endl;
    out << endl;
    out << indent() << "switch (Isset)" << endl;
    scope_up(out);
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        bool needs_typecast = false;
        string copy_op = get_deep_copy_method_call((*f_iter)->get_type(), needs_typecast);
        out << indent() << "case " << (*f_iter)->get_key() << ":" << endl;
        indent_up();
        out << indent() << "return Equals(As_" << (*f_iter)->get_name() << ", other.As_" << (*f_iter)->get_name() << ");" << endl;
        indent_down();
    }
    out << indent() << "default:" << endl;
    indent_up();
    out << indent() << "return true;" << endl;
    indent_down();
    indent_down();
    scope_down(out);
    scope_down(out);
    out << endl;

    out << indent() << "public override int GetHashCode()" << endl;
    out << indent() << "{" << endl;
    indent_up();
    out << indent() << "switch (Isset)" << endl;
    out << indent() << "{" << endl;
    indent_up();
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        bool needs_typecast = false;
        string copy_op = get_deep_copy_method_call((*f_iter)->get_type(), needs_typecast);
        out << indent() << "case " << (*f_iter)->get_key() << ":" << endl;
        indent_up();
        out << indent() << "return As_" << (*f_iter)->get_name() << ".GetHashCode();" << endl;
        indent_down();
    }
    out << indent() << "default:" << endl;
    indent_up();
    out << indent() << "return (new ___undefined()).GetHashCode();" << endl;
    indent_down();
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    if( ! suppress_deepcopy) {
        out << indent() << "public " << tunion->get_name() << " DeepCopy()" << endl;
        out << indent() << "{" << endl;
        indent_up();
        out << indent() << "switch (Isset)" << endl;
        out << indent() << "{" << endl;
        indent_up();
        for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
        {
            bool needs_typecast = false;
            string copy_op = get_deep_copy_method_call((*f_iter)->get_type(), needs_typecast);
            out << indent() << "case " << (*f_iter)->get_key() << ":" << endl;
            indent_up();
            out << indent() << "return new " << (*f_iter)->get_name() << "(As_" << (*f_iter)->get_name() << copy_op << ");" << endl;
            indent_down();
        }
        out << indent() << "default:" << endl;
        indent_up();
        out << indent() << "return new ___undefined();" << endl;
        indent_down();
        indent_down();
        out << indent() << "}" << endl;
        indent_down();
        out << indent() << "}" << endl << endl;
    }

    out << indent() << "public class ___undefined : " << tunion->get_name() << endl;
    out << indent() << "{" << endl;
    indent_up();

    out << indent() << "public override object Data { get { return null; } }" << endl
        << indent() << "public ___undefined() : base(0) {}" << endl << endl;

    if( ! suppress_deepcopy) {
        out << indent() << "public new ___undefined DeepCopy()" << endl;
        out << indent() << "{" << endl;
        indent_up();
        out << indent() << "return new ___undefined();" << endl;
        indent_down();
        out << indent() << "}" << endl << endl;
    }

    t_struct undefined_struct(program_,"___undefined");
    generate_netstd_struct_equals(out, &undefined_struct);
    generate_netstd_struct_hashcode(out, &undefined_struct);

    out << indent() << "public override global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "throw new TProtocolException( TProtocolException.INVALID_DATA, \"Cannot persist an union type which is not set.\");" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        generate_netstd_union_class(out, tunion, (*f_iter));
    }

    generate_netstd_union_reader(out, tunion);

    indent_down();
    out << indent() << "}" << endl << endl;

    end_netstd_namespace(out);
}